

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O0

void __thiscall
deqp::egl::Image::NativeSurface<eglu::NativePixmap>::NativeSurface
          (NativeSurface<eglu::NativePixmap> *this,
          MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> *surface,
          MovePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *native)

{
  PtrData<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> data;
  PtrData<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *pPVar1;
  MovePtr *this_00;
  NativePixmap *this_01;
  MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> local_30;
  MovePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *local_20;
  MovePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *native_local;
  MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> *surface_local;
  NativeSurface<eglu::NativePixmap> *this_local;
  
  this_00 = (MovePtr *)&local_30;
  local_20 = native;
  native_local = (MovePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *)surface;
  surface_local = (MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> *)this;
  de::details::MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::MovePtr
            ((MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> *)this_00,
             surface);
  ManagedSurface::ManagedSurface
            (&this->super_ManagedSurface,
             (MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> *)this_00);
  de::details::MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::~MovePtr
            (&local_30);
  (this->super_ManagedSurface)._vptr_ManagedSurface = (_func_int **)&PTR__NativeSurface_00678208;
  this_01 = (NativePixmap *)&this->m_native;
  pPVar1 = de::details::MovePtr::operator_cast_to_PtrData
                     ((PtrData<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *)native
                      ,this_00);
  data._8_8_ = pPVar1;
  data.ptr = this_01;
  de::details::UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>::UniquePtr
            ((UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *)this_01,data)
  ;
  return;
}

Assistant:

explicit		NativeSurface	(MovePtr<UniqueSurface>	surface,
									 MovePtr<T>				native)
						: ManagedSurface	(surface)
						, m_native			(native) {}